

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

btVector3 __thiscall btSoftBody::evaluateCom(btSoftBody *this)

{
  int iVar1;
  btScalar *in_RDI;
  btVector3 bVar2;
  int ni;
  int i;
  btVector3 com;
  undefined4 in_stack_ffffffffffffffc0;
  btScalar in_stack_ffffffffffffffc4;
  int local_28;
  btScalar local_24;
  btScalar local_20;
  btScalar local_1c [3];
  btVector3 local_10;
  
  local_1c[0] = 0.0;
  local_20 = 0.0;
  local_24 = 0.0;
  btVector3::btVector3(&local_10,local_1c,&local_20,&local_24);
  if ((*(byte *)((long)in_RDI + 0x259) & 1) != 0) {
    local_28 = 0;
    iVar1 = btAlignedObjectArray<btSoftBody::Node>::size
                      ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0xdc));
    for (; local_28 < iVar1; local_28 = local_28 + 1) {
      btAlignedObjectArray<btSoftBody::Node>::operator[]
                ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0xdc),local_28);
      btAlignedObjectArray<float>::operator[]
                ((btAlignedObjectArray<float> *)(in_RDI + 0xa0),local_28);
      bVar2 = ::operator*((btVector3 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                          ,in_RDI);
      in_stack_ffffffffffffffc4 = bVar2.m_floats[0];
      btVector3::operator+=(&local_10,(btVector3 *)&stack0xffffffffffffffc4);
    }
  }
  return (btVector3)local_10.m_floats;
}

Assistant:

btVector3		btSoftBody::evaluateCom() const
{
	btVector3	com(0,0,0);
	if(m_pose.m_bframe)
	{
		for(int i=0,ni=m_nodes.size();i<ni;++i)
		{
			com+=m_nodes[i].m_x*m_pose.m_wgh[i];
		}
	}
	return(com);
}